

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIrGeneration.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  ifstream fin;
  
  if (argc == 1) {
    iVar1 = generate();
    return iVar1;
  }
  lVar3 = 1;
  iVar1 = 0;
  do {
    if (argc <= lVar3) {
      return iVar1;
    }
    std::ifstream::ifstream(&fin,argv[lVar3],_S_in);
    std::ios::rdbuf((streambuf *)((long)&std::cin + *(long *)(std::cin + -0x18)));
    iVar2 = generate();
    iVar4 = iVar2;
    if (iVar2 < 1) {
      std::ifstream::close();
      std::ios::rdbuf((streambuf *)((long)&std::cin + *(long *)(std::cin + -0x18)));
      iVar4 = iVar1;
    }
    std::ifstream::~ifstream(&fin);
    lVar3 = lVar3 + 1;
    iVar1 = iVar4;
  } while (iVar2 < 1);
  return iVar4;
}

Assistant:

int main(int argc, char *argv[])
{
    if (argc == 1)
        return generate();
    else
        for (int i = 1; i < argc; i++)
        {
            std::ifstream fin(argv[i]);
            auto cinBuf = std::cin.rdbuf(fin.rdbuf());
            int code = generate();
            if (code > 0)
                return code;
            fin.close();
            std::cin.rdbuf(cinBuf);
        }
}